

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::BuildEmpty(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  uint uVar4;
  LabelInstr *branchTarget;
  JITTimeFunctionBody *pJVar5;
  RegOpnd *pRVar6;
  RegOpnd *pRVar7;
  Instr *pIVar8;
  BranchInstr *pBVar9;
  undefined4 *puVar10;
  Type *pTVar11;
  bool *pbVar12;
  uint *puVar13;
  IntConstOpnd *pIVar14;
  RegOpnd *src2Opnd;
  undefined6 in_register_00000032;
  SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
  *pSVar15;
  int iVar16;
  
  Js::ByteCodeReader::Empty(&this->m_jnReader);
  iVar16 = (int)CONCAT62(in_register_00000032,newOpcode);
  branchTarget = (LabelInstr *)IR::Instr::New(newOpcode,this->m_func);
  if (iVar16 == 8) {
    bVar2 = Func::IsJitInDebugMode(this->m_func);
    if (bVar2) {
      InsertBailOutForDebugger(this,offset,BailOutExplicit,(Instr *)0x0);
      return;
    }
LAB_0048d6d2:
    AddInstr(this,&branchTarget->super_Instr,offset);
    return;
  }
  if (iVar16 == 0x24) {
    pRVar6 = BuildDstOpnd(this,0,TyVar,false,false);
    IR::Instr::SetSrc1((Instr *)branchTarget,&pRVar6->super_Opnd);
    goto LAB_0048d6d2;
  }
  if (iVar16 != 0x181) {
    if (iVar16 == 0xea) {
      this->finallyBlockLevel = this->finallyBlockLevel - 1;
      goto LAB_0048d6d2;
    }
    if (iVar16 == 0xeb) {
      pSVar15 = this->handlerOffsetStack;
      if ((pSVar15 !=
           (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
            *)0x0) &&
         ((SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
           *)(pSVar15->
             super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
             ).super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar15)) {
        pTVar11 = SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                  ::Head(&pSVar15->
                          super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                        );
        pbVar12 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::Second(pTVar11);
        if (*pbVar12 == true) {
          pBVar9 = IR::BranchInstr::New(BrOnException,(LabelInstr *)0x0,this->m_func);
          pTVar11 = SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                    ::Head(&this->handlerOffsetStack->
                            super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                          );
          puVar13 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::First(pTVar11);
          AddBranchInstr(this,pBVar9,offset,*puVar13);
        }
      }
      branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
      pBVar9 = IR::BranchInstr::New(Leave,branchTarget,this->m_func);
    }
    else {
      if (iVar16 == 0x170) {
        pSVar15 = this->handlerOffsetStack;
        if (pSVar15 !=
            (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          if ((SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
               *)(pSVar15->
                 super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                 ).super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar15) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar10 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1ba4,"(!this->handlerOffsetStack->Empty())",
                               "!this->handlerOffsetStack->Empty()");
            if (!bVar2) goto LAB_0048d965;
            *puVar10 = 0;
            pSVar15 = this->handlerOffsetStack;
          }
          pTVar11 = SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                    ::Head(&pSVar15->
                            super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                          );
          pbVar12 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::Second(pTVar11);
          if (*pbVar12 != false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar10 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1ba5,"(this->handlerOffsetStack->Top().Second() == false)",
                               "this->handlerOffsetStack->Top().Second() == false");
            if (!bVar2) goto LAB_0048d965;
            *puVar10 = 0;
          }
          SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
          ::Pop(this->handlerOffsetStack);
        }
        this->finallyBlockLevel = this->finallyBlockLevel + 1;
        branchTarget = (LabelInstr *)IR::Instr::New(Finally,this->m_func);
        goto LAB_0048d6d2;
      }
      if (iVar16 != 0xdc) goto LAB_0048d6d2;
      pJVar5 = Func::GetJITFunctionBody(this->m_func);
      RVar3 = JITTimeFunctionBody::GetLocalClosureReg(pJVar5);
      pRVar6 = BuildSrcOpnd(this,RVar3,TyVar);
      branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
      pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
      pIVar8 = IR::Instr::New(LdFuncExpr,&pRVar7->super_Opnd,this->m_func);
      AddInstr(this,pIVar8,offset);
      pBVar9 = IR::BranchInstr::New
                         (BrFncCachedScopeNeq,branchTarget,&pRVar7->super_Opnd,&pRVar6->super_Opnd,
                          this->m_func);
      AddInstr(this,&pBVar9->super_Instr,offset);
      pBVar9 = (BranchInstr *)IR::Instr::New(CommitScope,this->m_func);
      IR::Instr::SetSrc1((Instr *)pBVar9,&pRVar6->super_Opnd);
    }
    AddInstr(this,&pBVar9->super_Instr,offset);
    offset = 0xffffffff;
    goto LAB_0048d6d2;
  }
  if (this->m_paramScopeDone == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1bbe,"(!this->IsParamScopeDone())","!this->IsParamScopeDone()");
    if (!bVar2) goto LAB_0048d965;
    *puVar10 = 0;
  }
  this->m_paramScopeDone = true;
  this_00 = this->m_func;
  if (this_00->m_localClosureSym == (StackSym *)0x0) {
    pJVar5 = Func::GetJITFunctionBody(this_00);
    uVar4 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar5);
    if (uVar4 == 0) {
      pJVar5 = Func::GetJITFunctionBody(this->m_func);
      bVar2 = JITTimeFunctionBody::HasScopeObject(pJVar5);
      if (bVar2) goto LAB_0048d70e;
    }
    else {
LAB_0048d70e:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1bc8,
                         "(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject())"
                         ,
                         "this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject()"
                        );
      if (!bVar2) {
LAB_0048d965:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar10 = 0;
    }
    pIVar14 = IR::IntConstOpnd::New(0,TyVar,this->m_func,false);
  }
  else {
    pIVar14 = (IntConstOpnd *)IR::RegOpnd::New(this_00->m_localClosureSym,TyVar,this_00);
  }
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetParamClosureReg(pJVar5);
  pRVar6 = BuildDstOpnd(this,RVar3,TyVar,false,false);
  pIVar8 = IR::Instr::New(Ld_A,&pRVar6->super_Opnd,&pIVar14->super_Opnd,this->m_func);
  AddInstr(this,pIVar8,offset);
  iVar16 = (int)pIVar8;
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  uVar4 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar5);
  if (uVar4 == 0) {
    pJVar5 = Func::GetJITFunctionBody(this->m_func);
    bVar2 = JITTimeFunctionBody::HasScopeObject(pJVar5);
    if (!bVar2) {
      return;
    }
  }
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::HasScopeObject(pJVar5);
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  if (bVar2) {
    bVar2 = JITTimeFunctionBody::HasCachedScopePropIds(pJVar5);
    if (bVar2) {
      BuildInitCachedScope(this,iVar16,-1);
      goto LAB_0048d8b6;
    }
    pJVar5 = Func::GetJITFunctionBody(this->m_func);
    RVar3 = JITTimeFunctionBody::GetLocalClosureReg(pJVar5);
    pRVar6 = BuildDstOpnd(this,RVar3,TyVar,false,false);
    pIVar8 = IR::Instr::New(NewScopeObject,&pRVar6->super_Opnd,this->m_func);
  }
  else {
    RVar3 = JITTimeFunctionBody::GetLocalClosureReg(pJVar5);
    pRVar6 = BuildDstOpnd(this,RVar3,TyVar,false,false);
    pJVar5 = Func::GetJITFunctionBody(this->m_func);
    uVar4 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar5);
    pIVar14 = IR::IntConstOpnd::New((ulong)(uVar4 + 2),TyUint32,this->m_func,false);
    pIVar8 = IR::Instr::New(NewScopeSlots,&pRVar6->super_Opnd,&pIVar14->super_Opnd,this->m_func);
  }
  AddInstr(this,pIVar8,0xffffffff);
LAB_0048d8b6:
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar5);
  pRVar6 = BuildDstOpnd(this,RVar3,TyVar,false,false);
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetLocalClosureReg(pJVar5);
  pRVar7 = BuildDstOpnd(this,RVar3,TyVar,false,false);
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar5);
  src2Opnd = BuildDstOpnd(this,RVar3,TyVar,false,false);
  pIVar8 = IR::Instr::New(LdFrameDisplay,&pRVar6->super_Opnd,&pRVar7->super_Opnd,
                          &src2Opnd->super_Opnd,this->m_func);
  AddInstr(this,pIVar8,0xffffffff);
  pIVar8->field_0x38 = pIVar8->field_0x38 | 4;
  return;
}

Assistant:

void
IRBuilder::BuildEmpty(Js::OpCode newOpcode, uint32 offset)
{
    IR::Instr *instr;

    m_jnReader.Empty();

    instr = IR::Instr::New(newOpcode, m_func);

    switch (newOpcode)
    {
    case Js::OpCode::CommitScope:
    {
        IR::RegOpnd *   src1Opnd;

        src1Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());

        IR::LabelInstr *labelNull = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

        IR::RegOpnd * funcExprOpnd = IR::RegOpnd::New(TyVar, m_func);
        instr = IR::Instr::New(Js::OpCode::LdFuncExpr, funcExprOpnd, m_func);
        this->AddInstr(instr, offset);

        IR::BranchInstr *branchInstr = IR::BranchInstr::New(Js::OpCode::BrFncCachedScopeNeq, labelNull,
            funcExprOpnd, src1Opnd, this->m_func);
        this->AddInstr(branchInstr, offset);

        instr = IR::Instr::New(newOpcode, this->m_func);
        instr->SetSrc1(src1Opnd);

        this->AddInstr(instr, offset);

        this->AddInstr(labelNull, Js::Constants::NoByteCodeOffset);
        return;
    }
    case Js::OpCode::Ret:
    {
        IR::RegOpnd *regOpnd = BuildDstOpnd(0);
        instr->SetSrc1(regOpnd);
        this->AddInstr(instr, offset);
        break;
    }

    case Js::OpCode::Leave:
    {
        IR::BranchInstr * branchInstr;
        IR::LabelInstr * labelInstr;

        if (this->handlerOffsetStack && !this->handlerOffsetStack->Empty() && this->handlerOffsetStack->Top().Second())
        {
            // If the try region has a break block, we don't want the Flowgraph to move all of that code out of the loop
            // because an exception will bring the control back into the loop. The branch out of the loop (which is the
            // reason for the code to be a break block) can still be moved out though.
            //
            // "BrOnException $catch" is inserted before Leave's in the try region to instrument flow from the try region
            // to the catch region (which is in the loop).
            IR::BranchInstr * brOnException = IR::BranchInstr::New(Js::OpCode::BrOnException, nullptr, this->m_func);
            this->AddBranchInstr(brOnException, offset, this->handlerOffsetStack->Top().First());
        }

        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        branchInstr = IR::BranchInstr::New(newOpcode, labelInstr, this->m_func);
        this->AddInstr(branchInstr, offset);
        this->AddInstr(labelInstr, Js::Constants::NoByteCodeOffset);
        break;
    }

    case Js::OpCode::LeaveNull:
        finallyBlockLevel--;
        this->AddInstr(instr, offset);
        break;

    case Js::OpCode::Finally:
        if (this->handlerOffsetStack)
        {
            AssertOrFailFast(!this->handlerOffsetStack->Empty());
            AssertOrFailFast(this->handlerOffsetStack->Top().Second() == false);
            this->handlerOffsetStack->Pop();
        }
        finallyBlockLevel++;
        this->AddInstr(IR::Instr::New(Js::OpCode::Finally, this->m_func), offset);
        break;

    case Js::OpCode::Break:
        if (m_func->IsJitInDebugMode())
        {
            // Add explicit bailout.
            this->InsertBailOutForDebugger(offset, IR::BailOutExplicit);
        }
        else
        {
            // Default behavior, let's keep it for now, removed in lowerer.
            this->AddInstr(instr, offset);
        }
        break;

    case Js::OpCode::BeginBodyScope:
    {
        // This marks the end of a param scope which is not merged with body scope.
        // So we have to first cache the closure so that we can use it to copy the initial values for
        // body syms from corresponding param syms (LdParamSlot). Body should get its own scope slot.
        Assert(!this->IsParamScopeDone());
        this->SetParamScopeDone();

        IR::Opnd * localClosureOpnd;
        if (this->m_func->GetLocalClosureSym() != nullptr)
        {
            localClosureOpnd = IR::RegOpnd::New(this->m_func->GetLocalClosureSym(), TyVar, this->m_func);
        }
        else
        {
            AssertOrFailFast(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject());
            localClosureOpnd = IR::IntConstOpnd::New(0, TyVar, this->m_func);
        }

        this->AddInstr(
            IR::Instr::New(
                Js::OpCode::Ld_A,
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetParamClosureReg()),
                localClosureOpnd,
                this->m_func),
            offset);

        // Create a new local closure for the body when either body scope has scope slots allocated or
        // eval is present which can leak declarations.
        if (this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() > 0 || this->m_func->GetJITFunctionBody()->HasScopeObject())
        {
            if (this->m_func->GetJITFunctionBody()->HasScopeObject())
            {
                if (this->m_func->GetJITFunctionBody()->HasCachedScopePropIds())
                {
                    this->BuildInitCachedScope(0, Js::Constants::NoByteCodeOffset);
                }
                else
                {
                    this->AddInstr(
                        IR::Instr::New(
                            Js::OpCode::NewScopeObject,
                            this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                            m_func),
                        Js::Constants::NoByteCodeOffset);
                }
            }
            else
            {
                this->AddInstr(
                    IR::Instr::New(
                        Js::OpCode::NewScopeSlots,
                        this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                        IR::IntConstOpnd::New(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() + Js::ScopeSlots::FirstSlotIndex, TyUint32, this->m_func),
                        m_func),
                    Js::Constants::NoByteCodeOffset);
            }

            IR::Instr* lfd = IR::Instr::New(
                Js::OpCode::LdFrameDisplay,
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg()),
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg()),
                this->m_func);
            this->AddInstr(
                lfd,
                Js::Constants::NoByteCodeOffset);
            lfd->isNonFastPathFrameDisplay = true;
        }
        break;
    }

    default:
        this->AddInstr(instr, offset);
        break;
    }
}